

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

void writeFile(string *file,string *content)

{
  ofstream out;
  long local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  std::ofstream::ofstream((ostream *)&local_210,(string *)file,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_210,(content->_M_dataplus)._M_p,content->_M_string_length);
  std::ostream::flush();
  std::ofstream::close();
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_208);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void writeFile(const std::string& file, const std::string& content)
{
    std::ofstream out(file);
    out << content;
    out.flush();
    out.close();
}